

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasquadtree.cpp
# Opt level: O0

void __thiscall
LASquadtree::raster_occupancy
          (LASquadtree *this,_func_BOOL_I32 *does_cell_exist,U32 *data,U32 min_x,U32 min_y,
          U32 level_index,U32 level,U32 stop_level)

{
  byte bVar1;
  BOOL BVar2;
  U32 UVar3;
  U32 level_00;
  int iVar4;
  uint uVar5;
  uint local_6c;
  uint local_68;
  U32 pos_y_1;
  U32 pos_x_1;
  U32 pos_1;
  U32 max_y_1;
  U32 size_2;
  U32 full_size_1;
  U32 pos_y;
  U32 pos_x;
  U32 pos;
  U32 max_y;
  U32 size_1;
  U32 full_size;
  U32 size;
  U32 adaptive_bit;
  U32 adaptive_pos;
  U32 cell_index;
  U32 level_index_local;
  U32 min_y_local;
  U32 min_x_local;
  U32 *data_local;
  _func_BOOL_I32 *does_cell_exist_local;
  LASquadtree *this_local;
  
  UVar3 = get_cell_index(this,level_index,level);
  bVar1 = (byte)stop_level;
  if ((this->adaptive[UVar3 >> 5] & 1 << ((byte)UVar3 & 0x1f)) == 0) {
    BVar2 = (*does_cell_exist)(UVar3);
    if (BVar2) {
      uVar5 = 1 << (bVar1 - (char)level & 0x1f);
      for (local_6c = min_y; local_6c < min_y + uVar5; local_6c = local_6c + 1) {
        pos_y_1 = local_6c * (1 << (bVar1 & 0x1f)) + min_x;
        for (local_68 = 0; local_68 < uVar5; local_68 = local_68 + 1) {
          data[pos_y_1 >> 5] = 1 << ((byte)pos_y_1 & 0x1f) | data[pos_y_1 >> 5];
          pos_y_1 = pos_y_1 + 1;
        }
      }
    }
  }
  else if (level < stop_level) {
    UVar3 = level_index * 4;
    level_00 = level + 1;
    iVar4 = 1 << (bVar1 - (char)level_00 & 0x1f);
    raster_occupancy(this,does_cell_exist,data,min_x,min_y,UVar3,level_00,stop_level);
    raster_occupancy(this,does_cell_exist,data,min_x + iVar4,min_y,UVar3 + 1,level_00,stop_level);
    raster_occupancy(this,does_cell_exist,data,min_x,min_y + iVar4,UVar3 + 2,level_00,stop_level);
    raster_occupancy(this,does_cell_exist,data,min_x + iVar4,min_y + iVar4,UVar3 + 3,level_00,
                     stop_level);
  }
  else {
    uVar5 = 1 << (bVar1 - (char)level & 0x1f);
    for (size_2 = min_y; size_2 < min_y + uVar5; size_2 = size_2 + 1) {
      pos_y = size_2 * (1 << (bVar1 & 0x1f)) + min_x;
      for (full_size_1 = 0; full_size_1 < uVar5; full_size_1 = full_size_1 + 1) {
        data[pos_y >> 5] = 1 << ((byte)pos_y & 0x1f) | data[pos_y >> 5];
        pos_y = pos_y + 1;
      }
    }
  }
  return;
}

Assistant:

void LASquadtree::raster_occupancy(BOOL(*does_cell_exist)(I32), U32* data, U32 min_x, U32 min_y, U32 level_index, U32 level, U32 stop_level) const
{
  U32 cell_index = get_cell_index(level_index, level);
  U32 adaptive_pos = cell_index/32;
  U32 adaptive_bit = ((U32)1) << (cell_index%32);
  // have we reached a leaf
  if (adaptive[adaptive_pos] & adaptive_bit) // interior node
  {
    if (level < stop_level) // do we need to continue
    {
      level_index <<= 2;
      level += 1;
      U32 size = 1 << (stop_level-level);
      // recurse into the four children
      raster_occupancy(does_cell_exist, data, min_x, min_y, level_index, level, stop_level);
      raster_occupancy(does_cell_exist, data, min_x+size, min_y, level_index + 1, level, stop_level);
      raster_occupancy(does_cell_exist, data, min_x, min_y+size, level_index + 2, level, stop_level);
      raster_occupancy(does_cell_exist, data, min_x+size, min_y+size, level_index + 3, level, stop_level);
      return;
    }
    else // no ... raster remaining subtree
    {
      U32 full_size = (1 << stop_level);
      U32 size = 1 << (stop_level-level);
      U32 max_y = min_y + size;
      U32 pos, pos_x, pos_y;
      for (pos_y = min_y; pos_y < max_y; pos_y++)
      {
        pos = pos_y*full_size + min_x;
        for (pos_x = 0; pos_x < size; pos_x++)
        {
          data[pos/32] |= (1<<(pos%32));
          pos++;
        }
      }
    }
  }
  else if (does_cell_exist(cell_index))
  {
    // raster actual cell
    U32 full_size = (1 << stop_level);
    U32 size = 1 << (stop_level-level);
    U32 max_y = min_y + size;
    U32 pos, pos_x, pos_y;
    for (pos_y = min_y; pos_y < max_y; pos_y++)
    {
      pos = pos_y*full_size + min_x;
      for (pos_x = 0; pos_x < size; pos_x++)
      {
        data[pos/32] |= (1<<(pos%32));
        pos++;
      }
    }
  }
}